

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O1

bool __thiscall
Assimp::DefaultLogger::attachStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  pointer *pppLVar1;
  pointer ppLVar2;
  LogStreamInfo *pLVar3;
  LogStream *pLVar4;
  iterator __position;
  pointer ppLVar5;
  uint uVar6;
  bool bVar7;
  LogStreamInfo *pInfo;
  LogStreamInfo *local_20;
  
  if (pStream != (LogStream *)0x0) {
    uVar6 = 0xf;
    if (severity != 0) {
      uVar6 = severity;
    }
    ppLVar5 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar2 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar7 = ppLVar5 == ppLVar2;
    if (!bVar7) {
      pLVar3 = *ppLVar5;
      pLVar4 = pLVar3->m_pStream;
      while (pLVar4 != pStream) {
        ppLVar5 = ppLVar5 + 1;
        bVar7 = ppLVar5 == ppLVar2;
        if (bVar7) goto LAB_002fb765;
        pLVar3 = *ppLVar5;
        pLVar4 = pLVar3->m_pStream;
      }
      pLVar3->m_uiErrorSeverity = pLVar3->m_uiErrorSeverity | uVar6;
      if (!bVar7) goto LAB_002fb79f;
    }
LAB_002fb765:
    local_20 = (LogStreamInfo *)operator_new(0x10);
    local_20->m_uiErrorSeverity = uVar6;
    local_20->m_pStream = pStream;
    __position._M_current =
         (this->m_StreamArray).
         super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_StreamArray).
        super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>::
      _M_realloc_insert<Assimp::LogStreamInfo*const&>
                ((vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>> *)
                 &this->m_StreamArray,__position,&local_20);
    }
    else {
      *__position._M_current = local_20;
      pppLVar1 = &(this->m_StreamArray).
                  super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppLVar1 = *pppLVar1 + 1;
    }
  }
LAB_002fb79f:
  return pStream != (LogStream *)0x0;
}

Assistant:

bool DefaultLogger::attachStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = Logger::Info | Logger::Err | Logger::Warn | Logger::Debugging;
    }

    for ( StreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it )
    {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity |= severity;
            return true;
        }
    }

    LogStreamInfo *pInfo = new LogStreamInfo( severity, pStream );
    m_StreamArray.push_back( pInfo );
    return true;
}